

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

int cpu_ldsw_data_ra_sparc(CPUArchState_conflict16 *env,target_ulong_conflict ptr,uintptr_t retaddr)

{
  int iVar1;
  
  if ((env->mmuregs[0] & 1) == 0) {
    iVar1 = cpu_ldsw_mmuidx_ra_sparc(env,ptr,2,retaddr);
    return iVar1;
  }
  iVar1 = cpu_ldsw_mmuidx_ra_sparc(env,ptr,env->psrs,retaddr);
  return iVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}